

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::
vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
::clear(vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
        *this)

{
  if (this->m_p !=
      (_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
       *)0x0) {
    free(this->m_p);
    this->m_p = (_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
                 *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }